

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer_contexts.hpp
# Opt level: O0

void __thiscall timing_registry::addToGroup(timing_registry *this,uint64_t guid,task_handle *hTask)

{
  task_handle *ptVar1;
  pointer ppVar2;
  _Node_iterator_base<std::pair<const_unsigned_long,_timing_registry::task_info>,_false> local_50;
  iterator git;
  uint64_t local_38;
  _Node_iterator_base<std::pair<const_unsigned_long,_timing_registry::task_info>,_false> local_30;
  iterator tit;
  lock_guard<std::recursive_mutex> __l;
  task_handle *hTask_local;
  uint64_t guid_local;
  timing_registry *this_local;
  
  hTask_local = (task_handle *)guid;
  guid_local = (uint64_t)this;
  std::lock_guard<std::recursive_mutex>::lock_guard
            ((lock_guard<std::recursive_mutex> *)&tit,&this->m);
  local_38 = oqpi::task_handle::getUID(hTask);
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_long,_timing_registry::task_info,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_timing_registry::task_info>_>_>
       ::find(&this->tasks,&local_38);
  ptVar1 = hTask_local;
  ppVar2 = std::__detail::
           _Node_iterator<std::pair<const_unsigned_long,_timing_registry::task_info>,_false,_false>
           ::operator->((_Node_iterator<std::pair<const_unsigned_long,_timing_registry::task_info>,_false,_false>
                         *)&local_30);
  (ppVar2->second).parentUID = (task_uid)ptVar1;
  local_50._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_long,_timing_registry::task_info,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_timing_registry::task_info>_>_>
       ::find(&this->tasks,(key_type *)&hTask_local);
  ppVar2 = std::__detail::
           _Node_iterator<std::pair<const_unsigned_long,_timing_registry::task_info>,_false,_false>
           ::operator->((_Node_iterator<std::pair<const_unsigned_long,_timing_registry::task_info>,_false,_false>
                         *)&local_50);
  std::vector<oqpi::task_handle,_std::allocator<oqpi::task_handle>_>::
  emplace_back<oqpi::task_handle>(&(ppVar2->second).children,hTask);
  ppVar2 = std::__detail::
           _Node_iterator<std::pair<const_unsigned_long,_timing_registry::task_info>,_false,_false>
           ::operator->((_Node_iterator<std::pair<const_unsigned_long,_timing_registry::task_info>,_false,_false>
                         *)&local_50);
  (ppVar2->second).isGroup = true;
  std::lock_guard<std::recursive_mutex>::~lock_guard((lock_guard<std::recursive_mutex> *)&tit);
  return;
}

Assistant:

void addToGroup(uint64_t guid, oqpi::task_handle hTask)
    {
        std::lock_guard<std::recursive_mutex> __l(m);
        // Flag the task as having a parent
        auto tit = tasks.find(hTask.getUID());
        tit->second.parentUID = guid;
        // Add this task to the parent
        auto git = tasks.find(guid);
        git->second.children.emplace_back(std::move(hTask));
        git->second.isGroup = true;
    }